

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> * __thiscall
kj::ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *this,
          ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *other)

{
  RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)
               0x0;
  other->endPtr = (Entry *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }